

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O2

void ZopfliStoreLitLenDist
               (unsigned_short length,unsigned_short dist,size_t pos,ZopfliLZ77Store *store)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  unsigned_short *puVar4;
  ulong uVar5;
  size_t *psVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar8 = store->size;
  if (uVar8 % 0x120 == 0) {
    uVar5 = uVar8;
    for (lVar10 = 0; lVar10 != 0x1200; lVar10 = lVar10 + 0x10) {
      if ((uVar5 & uVar5 - 1) == 0) {
        if (uVar5 == 0) {
          psVar6 = (size_t *)malloc(8);
        }
        else {
          psVar6 = (size_t *)realloc(store->ll_counts,uVar8 * 0x10 + lVar10);
        }
        store->ll_counts = psVar6;
      }
      else {
        psVar6 = store->ll_counts;
      }
      if (uVar8 == 0) {
        sVar7 = 0;
      }
      else {
        sVar7 = psVar6[uVar5 - 0x120];
      }
      psVar6[uVar5] = sVar7;
      uVar5 = uVar5 + 1;
    }
  }
  if ((uVar8 & 0x1f) == 0) {
    uVar5 = uVar8;
    for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
      if ((uVar5 & uVar5 - 1) == 0) {
        if (uVar5 == 0) {
          psVar6 = (size_t *)malloc(8);
        }
        else {
          psVar6 = (size_t *)realloc(store->d_counts,uVar8 * 0x10 + lVar10);
        }
        store->d_counts = psVar6;
      }
      else {
        psVar6 = store->d_counts;
      }
      if (uVar8 == 0) {
        sVar7 = 0;
      }
      else {
        sVar7 = psVar6[uVar5 - 0x20];
      }
      psVar6[uVar5] = sVar7;
      uVar5 = uVar5 + 1;
    }
  }
  uVar5 = store->size;
  if ((uVar5 & uVar5 - 1) == 0) {
    if (uVar5 == 0) {
      puVar4 = (unsigned_short *)malloc(2);
      uVar5 = 0;
    }
    else {
      puVar4 = (unsigned_short *)realloc(store->litlens,uVar5 << 2);
      uVar5 = store->size;
    }
    store->litlens = puVar4;
  }
  else {
    puVar4 = store->litlens;
  }
  puVar4[uVar5] = length;
  store->size = uVar8;
  uVar5 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    if (uVar8 == 0) {
      puVar4 = (unsigned_short *)malloc(2);
      store->dists = puVar4;
      *puVar4 = dist;
      psVar6 = (size_t *)malloc(8);
      uVar9 = 0;
    }
    else {
      puVar4 = (unsigned_short *)realloc(store->dists,uVar8 * 4);
      store->dists = puVar4;
      puVar4[store->size] = dist;
      store->size = uVar8;
      psVar6 = (size_t *)realloc(store->pos,uVar8 << 4);
      uVar9 = store->size;
    }
    store->pos = psVar6;
  }
  else {
    store->dists[uVar8] = dist;
    psVar6 = store->pos;
    uVar9 = uVar8;
  }
  lVar10 = uVar8 - uVar8 % 0x120;
  psVar6[uVar9] = pos;
  store->size = uVar8;
  bVar2 = (byte)(uVar5 >> 0x38);
  if (dist == 0) {
    if (bVar2 < 2) {
      if (uVar8 == 0) {
        puVar4 = (unsigned_short *)malloc(2);
        store->ll_symbol = puVar4;
        *puVar4 = length;
        puVar4 = (unsigned_short *)malloc(2);
        uVar8 = 0;
      }
      else {
        puVar4 = (unsigned_short *)realloc(store->ll_symbol,uVar8 << 2);
        store->ll_symbol = puVar4;
        puVar4[store->size] = length;
        store->size = uVar8;
        puVar4 = (unsigned_short *)realloc(store->d_symbol,uVar8 << 2);
        uVar8 = store->size;
      }
      store->d_symbol = puVar4;
    }
    else {
      store->ll_symbol[uVar8] = length;
      puVar4 = store->d_symbol;
    }
    puVar4[uVar8] = 0;
    store->size = uVar8 + 1;
    psVar6 = store->ll_counts + lVar10 + (ulong)(uint)length;
  }
  else {
    if (bVar2 < 2) {
      if (uVar8 == 0) {
        puVar4 = (unsigned_short *)malloc(2);
        uVar5 = 0;
      }
      else {
        puVar4 = (unsigned_short *)realloc(store->ll_symbol,uVar8 * 4);
        uVar5 = store->size;
      }
      store->ll_symbol = puVar4;
    }
    else {
      puVar4 = store->ll_symbol;
      uVar5 = uVar8;
    }
    iVar1 = *(int *)(ZopfliGetLengthSymbol_table + (ulong)(uint)length * 4);
    uVar9 = uVar8 & 0xffffffffffffffe0;
    puVar4[uVar5] = (unsigned_short)iVar1;
    store->size = uVar8;
    if (bVar2 < 2) {
      if (uVar8 == 0) {
        puVar4 = (unsigned_short *)malloc(2);
        uVar8 = 0;
      }
      else {
        puVar4 = (unsigned_short *)realloc(store->d_symbol,uVar8 << 2);
        uVar8 = store->size;
      }
      store->d_symbol = puVar4;
    }
    else {
      puVar4 = store->d_symbol;
    }
    uVar3 = ZopfliGetDistSymbol((uint)dist);
    puVar4[uVar8] = (unsigned_short)uVar3;
    store->size = uVar8 + 1;
    store->ll_counts[lVar10 + iVar1] = store->ll_counts[lVar10 + iVar1] + 1;
    psVar6 = store->d_counts + (uVar9 | uVar3);
  }
  *psVar6 = *psVar6 + 1;
  return;
}

Assistant:

void ZopfliStoreLitLenDist(unsigned short length, unsigned short dist,
                           size_t pos, ZopfliLZ77Store* store) {
  size_t i;
  /* Needed for using ZOPFLI_APPEND_DATA multiple times. */
  size_t origsize = store->size;
  size_t llstart = ZOPFLI_NUM_LL * (origsize / ZOPFLI_NUM_LL);
  size_t dstart = ZOPFLI_NUM_D * (origsize / ZOPFLI_NUM_D);

  /* Everytime the index wraps around, a new cumulative histogram is made: we're
  keeping one histogram value per LZ77 symbol rather than a full histogram for
  each to save memory. */
  if (origsize % ZOPFLI_NUM_LL == 0) {
    size_t llsize = origsize;
    for (i = 0; i < ZOPFLI_NUM_LL; i++) {
      ZOPFLI_APPEND_DATA(
          origsize == 0 ? 0 : store->ll_counts[origsize - ZOPFLI_NUM_LL + i],
          &store->ll_counts, &llsize);
    }
  }
  if (origsize % ZOPFLI_NUM_D == 0) {
    size_t dsize = origsize;
    for (i = 0; i < ZOPFLI_NUM_D; i++) {
      ZOPFLI_APPEND_DATA(
          origsize == 0 ? 0 : store->d_counts[origsize - ZOPFLI_NUM_D + i],
          &store->d_counts, &dsize);
    }
  }

  ZOPFLI_APPEND_DATA(length, &store->litlens, &store->size);
  store->size = origsize;
  ZOPFLI_APPEND_DATA(dist, &store->dists, &store->size);
  store->size = origsize;
  ZOPFLI_APPEND_DATA(pos, &store->pos, &store->size);
  assert(length < 259);

  if (dist == 0) {
    store->size = origsize;
    ZOPFLI_APPEND_DATA(length, &store->ll_symbol, &store->size);
    store->size = origsize;
    ZOPFLI_APPEND_DATA(0, &store->d_symbol, &store->size);
    store->ll_counts[llstart + length]++;
  } else {
    store->size = origsize;
    ZOPFLI_APPEND_DATA(ZopfliGetLengthSymbol(length),
                       &store->ll_symbol, &store->size);
    store->size = origsize;
    ZOPFLI_APPEND_DATA(ZopfliGetDistSymbol(dist),
                       &store->d_symbol, &store->size);
    store->ll_counts[llstart + ZopfliGetLengthSymbol(length)]++;
    store->d_counts[dstart + ZopfliGetDistSymbol(dist)]++;
  }
}